

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

bool cmCMakePresetsGraphInternal::PresetStringHelper(string *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  code *local_68 [2];
  code *local_58;
  code *pcStack_50;
  string local_40;
  
  if (PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::helper_abi_cxx11_
      == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)
                                 ::helper_abi_cxx11_);
    if (iVar2 != 0) {
      local_68[1] = (code *)0x0;
      local_68[0] = JsonErrors::INVALID_STRING;
      pcStack_50 = std::
                   _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
      cmJSONHelperBuilder::String
                (&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                  helper_abi_cxx11_,(ErrorGenerator *)local_68,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (local_58 != (_Manager_type)0x0) {
        (*local_58)((_Any_data *)local_68,(_Any_data *)local_68,__destroy_functor);
      }
      __cxa_atexit(std::_Function_base::~_Function_base,
                   &PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                    helper_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)
                           ::helper_abi_cxx11_);
    }
  }
  local_68[0] = (code *)value;
  local_40._M_dataplus._M_p = (pointer)state;
  if (PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::helper_abi_cxx11_.
      super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
              helper_abi_cxx11_._M_invoker)
                      ((_Any_data *)
                       &PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                        helper_abi_cxx11_,out,(Value **)local_68,(cmJSONState **)&local_40);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool PresetStringHelper(std::string& out, const Json::Value* value,
                        cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::String();
  return helper(out, value, state);
}